

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcFormalTypeList::add(CTcFormalTypeList *this,CTcFormalTypeEle *ele)

{
  CTcFormalTypeList *pCVar1;
  
  pCVar1 = (CTcFormalTypeList *)this->tail_;
  if ((CTcFormalTypeList *)this->tail_ == (CTcFormalTypeList *)0x0) {
    pCVar1 = this;
  }
  pCVar1->head_ = ele;
  this->tail_ = ele;
  ele->nxt_ = (CTcFormalTypeEle *)0x0;
  return;
}

Assistant:

void CTcFormalTypeList::add(CTcFormalTypeEle *ele)
{
    /* link it into our list */
    if (tail_ != 0)
        tail_->nxt_ = ele;
    else
        head_ = ele;
    tail_ = ele;
    ele->nxt_ = 0;
}